

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

int __thiscall Process::close(Process *this,int __fd)

{
  Process *pPVar1;
  uint streams_local;
  Process *this_local;
  
  if (((__fd & 4U) != 0) && (this->fdStdInWrite != 0)) {
    ::close(this->fdStdInWrite);
    this->fdStdInWrite = 0;
  }
  if (((__fd & 1U) != 0) && (this->fdStdOutRead != 0)) {
    ::close(this->fdStdOutRead);
    this->fdStdOutRead = 0;
  }
  pPVar1 = (Process *)(ulong)(__fd & 2U);
  if (((__fd & 2U) != 0) && (pPVar1 = this, this->fdStdErrRead != 0)) {
    ::close(this->fdStdErrRead);
    this->fdStdErrRead = 0;
  }
  return (int)pPVar1;
}

Assistant:

void Process::close(uint streams)
{
#ifdef _WIN32
  if(streams & stdinStream && hStdInWrite != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdInWrite);
    hStdInWrite = INVALID_HANDLE_VALUE;
  }
  if(streams & stdoutStream && hStdOutRead != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdOutRead);
    hStdOutRead = INVALID_HANDLE_VALUE;
  }
  if(streams & stderrStream && hStdErrRead != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdErrRead);
    hStdErrRead = INVALID_HANDLE_VALUE;
  }
#else
  if(streams & stdinStream && fdStdInWrite)
  {
    ::close(fdStdInWrite);
    fdStdInWrite = 0;
  }
  if(streams & stdoutStream && fdStdOutRead)
  {
    ::close(fdStdOutRead);
    fdStdOutRead = 0;
  }
  if(streams & stderrStream && fdStdErrRead)
  {
    ::close(fdStdErrRead);
    fdStdErrRead = 0;
  }
#endif
}